

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  long in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar6;
  uint32_t newWords;
  uint32_t oldWords;
  uint64_t newVal;
  SVInt *result;
  undefined8 in_stack_ffffffffffffff98;
  SVInt *in_stack_ffffffffffffffa0;
  undefined2 uVar7;
  bool in_stack_ffffffffffffffaa;
  undefined1 uVar8;
  bool in_stack_ffffffffffffffab;
  undefined1 uVar9;
  bitwidth_t in_stack_ffffffffffffffac;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 output;
  SVInt *in_stack_ffffffffffffffd0;
  
  if ((in_EDX < 0x41) && ((*(byte *)(in_RSI + 0xd) & 1) == 0)) {
    SVInt((SVInt *)in_RDI.pVal,in_stack_ffffffffffffffac,(uint64_t)in_stack_ffffffffffffffa0,
          SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
    uVar5 = extraout_RDX;
  }
  else {
    output = in_RDI;
    allocUninitialized(in_stack_ffffffffffffffac,in_stack_ffffffffffffffab,in_stack_ffffffffffffffaa
                      );
    uVar2 = getNumWords(*(bitwidth_t *)(in_RSI + 8),false);
    uVar3 = getNumWords(in_EDX,false);
    uVar7 = (undefined2)uVar3;
    uVar8 = (undefined1)(uVar3 >> 0x10);
    uVar9 = (undefined1)(uVar3 >> 0x18);
    uVar1 = *output.pVal;
    puVar4 = getRawData(in_stack_ffffffffffffffa0);
    uVar3 = (uint32_t)(uVar1 >> 0x20);
    signExtendCopy(output.pVal,(uint64_t *)CONCAT44(uVar2,CONCAT13(uVar9,CONCAT12(uVar8,uVar7))),
                   (bitwidth_t)((ulong)puVar4 >> 0x20),(uint32_t)puVar4,uVar3);
    if ((*(byte *)(in_RSI + 0xd) & 1) != 0) {
      signExtendCopy(output.pVal,(uint64_t *)CONCAT44(uVar2,CONCAT13(uVar9,CONCAT12(uVar8,uVar7))),
                     (bitwidth_t)((ulong)puVar4 >> 0x20),(uint32_t)puVar4,uVar3);
    }
    clearUnusedBits(in_stack_ffffffffffffffd0);
    uVar5 = extraout_RDX_00;
  }
  SVar6.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar6.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar6.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar6.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar6.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar6.super_SVIntStorage;
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    SLANG_ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}